

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

string * __thiscall
pbrt::CompensatedFloat::ToString_abi_cxx11_(string *__return_storage_ptr__,CompensatedFloat *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&,float_const&>
            (__return_storage_ptr__,"[ CompensatedFloat v: %f err: %f ]",&this->v,&this->err);
  return __return_storage_ptr__;
}

Assistant:

std::string CompensatedFloat::ToString() const {
    return StringPrintf("[ CompensatedFloat v: %f err: %f ]", v, err);
}